

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFiltersExport.cpp
# Opt level: O1

char * helicsFilterGetInfo(HelicsFilter filt)

{
  HelicsFilter pvVar1;
  string *psVar2;
  
  pvVar1 = (HelicsFilter)0x0;
  if ((filt != (HelicsFilter)0x0) && (*(int *)((long)filt + 4) == -0x13d9fed9)) {
    pvVar1 = filt;
  }
  if (pvVar1 == (HelicsFilter)0x0) {
    psVar2 = &gHelicsEmptyStr_abi_cxx11_;
  }
  else {
    psVar2 = helics::Interface::getInfo_abi_cxx11_(*(Interface **)((long)pvVar1 + 8));
  }
  return (psVar2->_M_dataplus)._M_p;
}

Assistant:

const char* helicsFilterGetInfo(HelicsFilter filt)
{
    auto* filtObj = getFilterObj(filt, nullptr);
    if (filtObj == nullptr) {
        return gHelicsEmptyStr.c_str();
    }
    try {
        const std::string& info = filtObj->filtPtr->getInfo();
        return info.c_str();
    }
    // LCOV_EXCL_START
    catch (...) {
        return gHelicsEmptyStr.c_str();
    }
    // LCOV_EXCL_STOP
}